

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_perftest.cc
# Opt level: O3

int main(int argc,char **argv)

{
  float fVar1;
  char *__s;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int64_t iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vector<float,_std::allocator<float>_> times;
  string err;
  string buf;
  DepfileParser parser;
  int local_f0;
  allocator<char> local_e9;
  float *local_e8;
  iterator iStack_e0;
  float *local_d8;
  string local_d0;
  string local_b0;
  ulong local_90;
  char **local_88;
  ulong local_80;
  ulong local_78;
  int64_t local_70;
  float local_68;
  undefined4 uStack_64;
  pointer local_58;
  pointer local_50;
  pointer local_40;
  
  if (argc < 2) {
    printf("usage: %s <file1> <file2...>\n",*argv);
    local_f0 = 1;
  }
  else {
    local_e8 = (float *)0x0;
    iStack_e0._M_current = (float *)0x0;
    local_d8 = (float *)0x0;
    local_90 = (ulong)(uint)argc;
    uVar5 = 1;
    local_f0 = 0;
    local_88 = argv;
    do {
      __s = local_88[uVar5];
      uVar9 = 0x400;
      local_80 = uVar5;
      do {
        local_70 = GetTimeMillis();
        local_78 = uVar9;
        do {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_d0._M_string_length = 0;
          local_d0.field_2._M_local_buf[0] = '\0';
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_e9);
          iVar4 = ReadFile((string *)&local_68,&local_b0,&local_d0);
          if ((pointer *)CONCAT44(uStack_64,local_68) != &local_58) {
            operator_delete((pointer *)CONCAT44(uStack_64,local_68),
                            (ulong)((long)&local_58->str_ + 1));
          }
          if (iVar4 < 0) {
            bVar3 = false;
            printf("%s: %s\n",__s,local_d0._M_dataplus._M_p);
            local_f0 = 1;
          }
          else {
            DepfileParser::DepfileParser((DepfileParser *)&local_68);
            bVar3 = DepfileParser::Parse((DepfileParser *)&local_68,&local_b0,&local_d0);
            if (!bVar3) {
              printf("%s: %s\n",__s,local_d0._M_dataplus._M_p);
              local_f0 = 1;
            }
            if (local_50 != (pointer)0x0) {
              operator_delete(local_50,(long)local_40 - (long)local_50);
            }
            pvVar2 = (void *)CONCAT44(uStack_64,local_68);
            if (pvVar2 != (void *)0x0) {
              operator_delete(pvVar2,(long)local_58 - (long)pvVar2);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                     local_d0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,
                            CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                     local_b0.field_2._M_local_buf[0]) + 1);
          }
          if (bVar3 == false) goto LAB_0010653c;
          uVar8 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar8;
        } while (uVar8 != 0);
        iVar6 = GetTimeMillis();
        uVar8 = (uint)local_78;
        if (100 < iVar6 - local_70) {
          local_68 = (float)((int)(iVar6 - local_70) * 1000) / (float)(int)uVar8;
          printf("%s: %.1fus\n",SUB84((double)local_68,0),__s);
          if (iStack_e0._M_current == local_d8) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_e8,iStack_e0,&local_68);
          }
          else {
            *iStack_e0._M_current = local_68;
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
          break;
        }
        uVar9 = (ulong)(uVar8 * 2);
      } while (uVar8 < 0x80000);
      uVar5 = local_80 + 1;
    } while (uVar5 != local_90);
    if (local_e8 == iStack_e0._M_current) {
      local_f0 = 0;
    }
    else {
      uVar5 = (long)iStack_e0._M_current - (long)local_e8 >> 2;
      fVar12 = *local_e8;
      fVar13 = 0.0;
      lVar7 = 0;
      fVar10 = fVar12;
      do {
        fVar1 = local_e8[lVar7];
        fVar11 = fVar1;
        if ((fVar10 <= fVar1) && (fVar11 = fVar10, fVar12 < fVar1)) {
          fVar12 = fVar1;
        }
        fVar13 = fVar13 + fVar1;
        lVar7 = lVar7 + 1;
        fVar10 = fVar11;
      } while (uVar5 + (uVar5 == 0) != lVar7);
      printf("min %.1fus  max %.1fus  avg %.1fus\n",SUB84((double)fVar11,0),(double)fVar12,
             (double)(fVar13 / (float)uVar5));
      local_f0 = 0;
    }
LAB_0010653c:
    if (local_e8 != (float *)0x0) {
      operator_delete(local_e8,(long)local_d8 - (long)local_e8);
    }
  }
  return local_f0;
}

Assistant:

int main(int argc, char* argv[]) {
  if (argc < 2) {
    printf("usage: %s <file1> <file2...>\n", argv[0]);
    return 1;
  }

  vector<float> times;
  for (int i = 1; i < argc; ++i) {
    const char* filename = argv[i];

    for (int limit = 1 << 10; limit < (1<<20); limit *= 2) {
      int64_t start = GetTimeMillis();
      for (int rep = 0; rep < limit; ++rep) {
        string buf;
        string err;
        if (ReadFile(filename, &buf, &err) < 0) {
          printf("%s: %s\n", filename, err.c_str());
          return 1;
        }

        DepfileParser parser;
        if (!parser.Parse(&buf, &err)) {
          printf("%s: %s\n", filename, err.c_str());
          return 1;
        }
      }
      int64_t end = GetTimeMillis();

      if (end - start > 100) {
        int delta = (int)(end - start);
        float time = delta*1000 / (float)limit;
        printf("%s: %.1fus\n", filename, time);
        times.push_back(time);
        break;
      }
    }
  }

  if (!times.empty()) {
    float min = times[0];
    float max = times[0];
    float total = 0;
    for (size_t i = 0; i < times.size(); ++i) {
      total += times[i];
      if (times[i] < min)
        min = times[i];
      else if (times[i] > max)
        max = times[i];
    }

    printf("min %.1fus  max %.1fus  avg %.1fus\n",
           min, max, total / times.size());
  }

  return 0;
}